

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

string * ORPG::Utils::file_to_string(string *__return_storage_ptr__,string *file)

{
  char cVar1;
  long *plVar2;
  istream *piVar3;
  long *plVar4;
  ulong *puVar5;
  string buffer;
  ifstream screen_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [65];
  
  Core::DATA_LOCATION_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_258);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_268 = *plVar4;
    lStack_260 = plVar2[3];
    local_278 = &local_268;
  }
  else {
    local_268 = *plVar4;
    local_278 = (long *)*plVar2;
  }
  local_270 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_278,(ulong)(file->_M_dataplus)._M_p);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  puVar5 = (ulong *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5) {
    local_2a0.field_2._M_allocated_capacity = *puVar5;
    local_2a0.field_2._8_8_ = plVar2[3];
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *puVar5;
    local_2a0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_2a0._M_string_length = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::ifstream::ifstream((istream *)local_238,(string *)&local_2a0,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    Core::DATA_LOCATION_abi_cxx11_();
    printf("file %s/%s could not be opened\n",local_2a0._M_dataplus._M_p,(file->_M_dataplus)._M_p);
  }
  else {
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    local_2a0._M_string_length = 0;
    local_2a0.field_2._M_allocated_capacity =
         local_2a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_280 = &__return_storage_ptr__->field_2;
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2a0,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+(&local_258,__return_storage_ptr__,&local_2a0);
      plVar2 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&local_258,local_258._M_string_length,0,'\x01');
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_268 = *plVar4;
        lStack_260 = plVar2[3];
        local_278 = &local_268;
      }
      else {
        local_268 = *plVar4;
        local_278 = (long *)*plVar2;
      }
      local_270 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_278);
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
    }
    std::ifstream::close();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

string file_to_string(string file) {
            // Open the data file for the current screen
            ifstream screen_file(Core::DATA_LOCATION()+"/"+file);
            string ret = "";

            if (screen_file.is_open()) {
                string buffer;

                while (getline(screen_file, buffer)) {
                    ret = ret + buffer + '\n';
                }
                screen_file.close();
            }
            else {
                // TODO: Raise an exception here, if an asset file
                // cannot be opened then something serious has gone wrong.
                printf("file %s/%s could not be opened\n", Core::DATA_LOCATION().c_str(), file.c_str());
            }

            return ret;
        }